

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O0

void cuddGetBranches(DdNode *g,DdNode **g1,DdNode **g0)

{
  DdNode *G;
  DdNode **g0_local;
  DdNode **g1_local;
  DdNode *g_local;
  
  *g1 = *(DdNode **)(((ulong)g & 0xfffffffffffffffe) + 0x10);
  *g0 = *(DdNode **)(((ulong)g & 0xfffffffffffffffe) + 0x18);
  if (((ulong)g & 1) != 0) {
    *g1 = (DdNode *)((ulong)*g1 ^ 1);
    *g0 = (DdNode *)((ulong)*g0 ^ 1);
  }
  return;
}

Assistant:

void
cuddGetBranches(
  DdNode * g,
  DdNode ** g1,
  DdNode ** g0)
{
    DdNode      *G = Cudd_Regular(g);

    *g1 = cuddT(G);
    *g0 = cuddE(G);
    if (Cudd_IsComplement(g)) {
        *g1 = Cudd_Not(*g1);
        *g0 = Cudd_Not(*g0);
    }

}